

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O3

ChQuaternion<double> * __thiscall
chrono::ChFunctionRotation_SQUAD::Get_q
          (ChQuaternion<double> *__return_storage_ptr__,ChFunctionRotation_SQUAD *this,double s)

{
  double *pdVar1;
  pointer pCVar2;
  pointer pCVar3;
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  ChQuaternion<double> slerp1;
  ChQuaternion<double> slerp0;
  ChQuaternion<double> s1;
  ChQuaternion<double> s0;
  ChQuaternion<double> local_138;
  ChQuaternion<double> local_118;
  undefined1 local_f8 [32];
  undefined1 local_d8 [40];
  ChQuaternion<double> local_b0;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  if (this->closed == true) {
    s = fmod(s,1.0);
  }
  dVar10 = ComputeKnotUfromU(this,s);
  uVar8 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  pdVar1 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar9 = 2;
  if (2 < (long)uVar8) {
    uVar9 = uVar8;
  }
  uVar6 = 0xffffffffffffffff;
  do {
    uVar7 = uVar9 - 2;
    if ((2 - uVar9) + uVar6 == -1) break;
    lVar5 = uVar6 + 2;
    uVar7 = uVar6 + 1;
    uVar6 = uVar7;
  } while (pdVar1[lVar5] <= dVar10);
  if ((long)uVar7 < (long)uVar8) {
    uVar9 = (ulong)((int)uVar7 + 1);
    if (uVar9 < uVar8) {
      pCVar2 = (this->rotations).
               super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8._0_8_ = pCVar2[uVar7].m_data[0];
      local_d8._8_8_ = pCVar2[uVar7].m_data[1];
      local_d8._16_16_ = *(undefined1 (*) [16])(pCVar2[uVar7].m_data + 2);
      local_f8._0_8_ = pCVar2[uVar9].m_data[0];
      local_f8._8_8_ = pCVar2[uVar9].m_data[1];
      local_f8._16_16_ = *(undefined1 (*) [16])(pCVar2[uVar9].m_data + 2);
      if ((int)uVar7 == 0) {
        if (this->closed == true) {
          pCVar3 = (this->rotations).
                   super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_138.m_data[2] = pCVar3[-2].m_data[2];
          local_138.m_data[3] = pCVar3[-2].m_data[3];
          local_138.m_data[0] = pCVar3[-2].m_data[0];
          local_138.m_data[1] = pCVar3[-2].m_data[1];
        }
        else {
          auVar4 = vshufpd_avx(local_d8._16_16_,local_d8._16_16_,1);
          local_138.m_data[3] = auVar4._0_8_;
          local_138.m_data[2] = (double)vmovlpd_avx(local_d8._16_16_);
          local_138.m_data[0] = (double)local_d8._0_8_;
          local_138.m_data[1] = (double)local_d8._8_8_;
        }
      }
      else {
        uVar8 = uVar7 & 0xffffffff;
        local_138.m_data[2] = pCVar2[uVar8 - 1].m_data[2];
        local_138.m_data[3] = pCVar2[uVar8 - 1].m_data[3];
        local_138.m_data[0] = pCVar2[uVar8 - 1].m_data[0];
        local_138.m_data[1] = pCVar2[uVar8 - 1].m_data[1];
      }
      if (uVar7 < ((long)(this->rotations).
                         super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 5) - 2U) {
        uVar8 = uVar7 & 0xffffffff;
        local_118.m_data[2] = pCVar2[uVar8 + 2].m_data[2];
        local_118.m_data[3] = pCVar2[uVar8 + 2].m_data[3];
        local_118.m_data[0] = pCVar2[uVar8 + 2].m_data[0];
        local_118.m_data[1] = pCVar2[uVar8 + 2].m_data[1];
      }
      else if (this->closed == true) {
        local_118.m_data[2] = pCVar2[1].m_data[2];
        local_118.m_data[3] = pCVar2[1].m_data[3];
        local_118.m_data[0] = pCVar2[1].m_data[0];
        local_118.m_data[1] = pCVar2[1].m_data[1];
      }
      else {
        auVar4 = vshufpd_avx(local_f8._16_16_,local_f8._16_16_,1);
        local_118.m_data[3] = auVar4._0_8_;
        local_118.m_data[2] = (double)vmovlpd_avx(local_f8._16_16_);
        local_118.m_data[0] = (double)local_f8._0_8_;
        local_118.m_data[1] = (double)local_f8._8_8_;
      }
      dVar10 = (dVar10 - pdVar1[uVar7]) / (pdVar1[uVar9] - pdVar1[uVar7]);
      QUADRANGLE(&local_50,&local_138,(ChQuaternion<double> *)local_d8,
                 (ChQuaternion<double> *)local_f8);
      QUADRANGLE(&local_70,(ChQuaternion<double> *)local_d8,(ChQuaternion<double> *)local_f8,
                 &local_118);
      SLERP(&local_90,(ChQuaternion<double> *)local_d8,(ChQuaternion<double> *)local_f8,dVar10);
      SLERP(&local_b0,&local_50,&local_70,dVar10);
      SLERP(__return_storage_ptr__,&local_90,&local_b0,(dVar10 + dVar10) * (1.0 - dVar10));
      return __return_storage_ptr__;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

ChQuaternion<> ChFunctionRotation_SQUAD::Get_q(double s) const {
	
	double fs = space_fx->Get_y(s);

	double mU;
	if (this->closed)
		mU = fmod(fs, 1.0);
	else
		mU = fs;

    double u = ComputeKnotUfromU(mU);

	// Linear search of span in knot vector. Bisection could be faster, but for small number of knots this is efficient anyway.
	int spanU = 0;
	for (; spanU < this->knots.size()-2; ++spanU)
		if (u < this->knots(spanU+1))
			break;
	
	double span_t = (u - this->knots(spanU)) / (this->knots(spanU + 1) - this->knots(spanU));

	ChQuaternion<> q1 = rotations[spanU];
	ChQuaternion<> q2 = rotations[spanU+1];
	
	ChQuaternion<> q0;
	ChQuaternion<> q3;
	
	if (spanU > 0) {
		q0 = rotations[spanU - 1];
	} 
	else {
		if (this->closed)
			q0 = rotations[rotations.size()-2];
		else
			q0 = q1;
	}

	if (spanU < rotations.size()-2) {
		q3 = rotations[spanU +2];
	} 
	else {
		if (this->closed)
			q3 = rotations[1];
		else
			q3 = q2;
	}

	// TEST: do a simple SLERP
	//return SLERP(q1, q2, span_t);

	ChQuaternion<> s0 = QUADRANGLE(q0, q1, q2);
	ChQuaternion<> s1 = QUADRANGLE(q1, q2, q3);
	
	ChQuaternion<> slerp0 = SLERP(q1, q2, span_t);
    ChQuaternion<> slerp1 = SLERP(s0, s1, span_t);
        
	return SLERP(slerp0, slerp1, 2.0 * span_t * (1.0 - span_t));

}